

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O0

void __thiscall Assimp::TextureTransformStep::Execute(TextureTransformStep *this,aiScene *pScene)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint *puVar6;
  _List_node_base *p_Var7;
  aiVector3D *paVar8;
  bool bVar9;
  size_t sVar10;
  undefined4 uVar11;
  list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *plVar12;
  uint uVar13;
  aiMaterialProperty *paVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  Logger *pLVar19;
  float *pfVar20;
  reference pvVar21;
  reference pSVar22;
  reference pvVar23;
  size_type sVar24;
  pointer this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar25;
  basic_formatter *pbVar26;
  ulong uVar27;
  char *pcVar28;
  char *pcVar29;
  aiVector3t<float> *paVar30;
  reference pSVar31;
  aiVector3t<float> aVar32;
  aiVector3t<float> *local_cd0;
  aiVector3t<float> *local_ca8;
  bool local_bb9;
  bool local_baa;
  bool local_ba9;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  string local_9e8;
  undefined8 local_9c8;
  float local_9c0;
  undefined8 local_9b8;
  float local_9b0;
  aiMatrix3x3t<float> local_9ac;
  aiMatrix3x3t<float> local_988;
  aiMatrix3x3t<float> local_964;
  aiMatrix3x3t<float> local_940;
  undefined1 local_91c [8];
  aiMatrix3x3 m5;
  aiMatrix3x3 m4;
  aiMatrix3x3 m3;
  aiMatrix3x3 m2;
  aiMatrix3x3 matrix;
  aiVector2D *scl;
  aiVector2D *trl;
  aiVector3D *end;
  aiVector3D *dest;
  aiVector3D *src;
  _List_node_base *local_838;
  uint local_830;
  uint local_82c;
  uint m;
  uint n_5;
  uint local_81c;
  uint n_4;
  aiVector3D *old [8];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_658;
  uint local_634;
  uint size;
  uint local_5ec;
  iterator iStack_5e8;
  uint n_3;
  _List_node_base *local_5e0;
  uint local_5d8;
  byte abStack_5d4 [4];
  uint n_2;
  bool ref [8];
  uint t;
  _Self local_5c0;
  _List_node_base *local_5b8;
  _List_node_base *local_5b0;
  const_iterator local_5a8;
  _List_node_base *local_5a0;
  const_iterator local_598;
  _List_node_base *local_590;
  _Self local_588;
  _Self local_580;
  _List_node_base *local_578;
  _List_iterator<Assimp::STransformVecInfo> local_570;
  iterator it2;
  iterator it_1;
  uint local_558;
  uint untransformed;
  uint cnt_1;
  bool need;
  bool veto;
  list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *local_548;
  MeshTrafoList *trafo;
  aiMesh *mesh_1;
  uint q;
  uint transformedChannels;
  uint inChannels;
  uint outChannels;
  char buffer [1024];
  _Self local_120;
  _Self local_118;
  _List_node_base *local_110;
  _List_iterator<Assimp::STransformVecInfo> local_108;
  iterator it;
  uint uv;
  aiMesh *mesh;
  uint n_1;
  int local_e4;
  uint n;
  uint cnt;
  float fStack_d8;
  aiVector2D local_d4;
  uint local_cc;
  aiMaterialProperty *paStack_c8;
  uint a3;
  aiMaterialProperty *prop2;
  undefined1 auStack_b8 [4];
  uint a2;
  TTUpdateInfo update;
  STransformVecInfo info;
  aiMaterialProperty *prop;
  uint a;
  aiMaterial *mat;
  uint i;
  allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>
  local_31;
  undefined1 local_30 [8];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  meshLists;
  aiScene *pScene_local;
  TextureTransformStep *this_local;
  
  meshLists.
  super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pScene;
  pLVar19 = DefaultLogger::get();
  Logger::debug(pLVar19,"TransformUVCoordsProcess begin");
  sVar10 = ((meshLists.
             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>).
           _M_impl._M_node._M_size;
  std::
  allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>
  ::allocator(&local_31);
  std::
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  ::vector((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
            *)local_30,(ulong)(uint)sVar10,&local_31);
  std::
  allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>
  ::~allocator(&local_31);
  for (mat._0_4_ = 0;
      (uint)mat <
      *(uint *)&meshLists.
                super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                ._M_impl._M_node.super__List_node_base._M_prev; mat._0_4_ = (uint)mat + 1) {
    puVar6 = *(uint **)(meshLists.
                        super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                        super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                        ._M_impl._M_node._M_size + (ulong)(uint)mat * 8);
    for (prop._4_4_ = 0; prop._4_4_ < puVar6[2]; prop._4_4_ = prop._4_4_ + 1) {
      info.updateList.super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
      _M_impl._M_node._M_size = *(size_t *)(*(long *)puVar6 + (ulong)prop._4_4_ * 8);
      iVar17 = strcmp((char *)(info.updateList.
                               super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                               ._M_impl._M_node._M_size + 4),"$tex.file");
      if (iVar17 == 0) {
        STransformVecInfo::STransformVecInfo((STransformVecInfo *)&update.semantic);
        TTUpdateInfo::TTUpdateInfo((TTUpdateInfo *)auStack_b8);
        update.mat._0_4_ =
             *(undefined4 *)
              (info.updateList.
               super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl
               ._M_node._M_size + 0x404);
        update.mat._4_4_ =
             *(undefined4 *)
              (info.updateList.
               super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl
               ._M_node._M_size + 0x408);
        update.directShortcut = puVar6;
        for (prop2._4_4_ = 0; prop2._4_4_ < puVar6[2]; prop2._4_4_ = prop2._4_4_ + 1) {
          paStack_c8 = *(aiMaterialProperty **)(*(long *)puVar6 + (ulong)prop2._4_4_ * 8);
          if ((paStack_c8->mSemantic ==
               *(uint *)(info.updateList.
                         super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                         ._M_impl._M_node._M_size + 0x404)) &&
             (paStack_c8->mIndex ==
              *(uint *)(info.updateList.
                        super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                        ._M_impl._M_node._M_size + 0x408))) {
            iVar17 = strcmp((paStack_c8->mKey).data,"$tex.uvwsrc");
            if (iVar17 == 0) {
              info.super_aiUVTransform.mScaling.y = *(float *)paStack_c8->mData;
              _auStack_b8 = (uint *)paStack_c8->mData;
            }
            else {
              iVar17 = strcmp((paStack_c8->mKey).data,"$tex.mapmodeu");
              if (iVar17 == 0) {
                info.super_aiUVTransform.mRotation = *(ai_real *)paStack_c8->mData;
              }
              else {
                iVar17 = strcmp((paStack_c8->mKey).data,"$tex.mapmodev");
                if (iVar17 == 0) {
                  info.uvIndex = *(uint *)paStack_c8->mData;
                }
                else {
                  iVar17 = strcmp((paStack_c8->mKey).data,"$tex.uvtrafo");
                  paVar14 = paStack_c8;
                  if (iVar17 == 0) {
                    if (paStack_c8->mDataLength < 0x14) {
                      __assert_fail("prop2->mDataLength >= 20",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TextureTransform.cpp"
                                    ,0x10f,
                                    "virtual void Assimp::TextureTransformStep::Execute(aiScene *)")
                      ;
                    }
                    pcVar28 = paStack_c8->mData;
                    update._16_8_ = *(undefined8 *)pcVar28;
                    info.super_aiUVTransform.mTranslation = *(aiVector2D *)(pcVar28 + 8);
                    info.super_aiUVTransform.mScaling.x = *(float *)(pcVar28 + 0x10);
                    puVar6[2] = puVar6[2] - 1;
                    for (local_cc = prop2._4_4_; local_cc < puVar6[2]; local_cc = local_cc + 1) {
                      *(undefined8 *)(*(long *)puVar6 + (ulong)local_cc * 8) =
                           *(undefined8 *)(*(long *)puVar6 + (ulong)(local_cc + 1) * 8);
                    }
                    if (paStack_c8 != (aiMaterialProperty *)0x0) {
                      aiMaterialProperty::~aiMaterialProperty(paStack_c8);
                      operator_delete(paVar14,0x420);
                    }
                    prop2._4_4_ = prop2._4_4_ - 1;
                  }
                }
              }
            }
          }
        }
        if ((this->configFlags & 2) == 0) {
          info.super_aiUVTransform.mScaling.x = 0.0;
        }
        if ((this->configFlags & 1) == 0) {
          aiVector2t<float>::aiVector2t(&local_d4,1.0,1.0);
          info.super_aiUVTransform.mTranslation = local_d4;
        }
        if ((this->configFlags & 4) == 0) {
          aiVector2t<float>::aiVector2t((aiVector2t<float> *)&cnt,0.0,0.0);
          update.semantic = cnt;
          update.index = (uint)fStack_d8;
        }
        PreProcessUVTransform(this,(STransformVecInfo *)&update.semantic);
        n = 7;
        pfVar20 = (float *)std::min<unsigned_int>((uint *)&info.super_aiUVTransform.mScaling.y,&n);
        info.super_aiUVTransform.mScaling.y = *pfVar20;
        local_e4 = 0;
        for (n_1 = 0; n_1 < (uint)((meshLists.
                                    super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                  )._M_impl._M_node._M_size; n_1 = n_1 + 1) {
          if (*(uint *)((long)((&(meshLists.
                                  super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                                  super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next)[n_1] +
                              0xe) + 8) == (uint)mat) {
            local_e4 = local_e4 + 1;
          }
        }
        if (local_e4 != 0) {
          if (local_e4 != 1) {
            info.mapU = ~aiTextureMapMode_Wrap;
          }
          for (mesh._0_4_ = 0;
              (uint)mesh <
              (uint)((meshLists.
                      super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                    )._M_impl._M_node._M_size; mesh._0_4_ = (uint)mesh + 1) {
            p_Var7 = (&(meshLists.
                        super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                        super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                        ._M_impl._M_node.super__List_node_base._M_next)->_M_next)[(uint)mesh];
            if ((*(uint *)((long)(p_Var7 + 0xe) + 8) == (uint)mat) &&
               (p_Var7[7]._M_next != (_List_node_base *)0x0)) {
              it._M_node._4_4_ = info.super_aiUVTransform.mScaling.y;
              if (*(long *)((long)(p_Var7 + 7) +
                           (ulong)(uint)info.super_aiUVTransform.mScaling.y * 8) == 0) {
                it._M_node._4_4_ = 0.0;
              }
              if (*(uint *)((long)(p_Var7 + 0xb) +
                           (ulong)(uint)info.super_aiUVTransform.mScaling.y * 4) < 3) {
                std::_List_iterator<Assimp::STransformVecInfo>::_List_iterator(&local_108);
                pvVar21 = std::
                          vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                          ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                        *)local_30,(ulong)(uint)mesh);
                local_110 = (_List_node_base *)
                            std::__cxx11::
                            list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                            ::begin(pvVar21);
                local_108._M_node = local_110;
                while( true ) {
                  pvVar21 = std::
                            vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                          *)local_30,(ulong)(uint)mesh);
                  local_118._M_node =
                       (_List_node_base *)
                       std::__cxx11::
                       list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
                       end(pvVar21);
                  bVar15 = std::operator!=(&local_108,&local_118);
                  if (!bVar15) break;
                  pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_108);
                  bVar15 = STransformVecInfo::operator==
                                     (pSVar22,(STransformVecInfo *)&update.semantic);
                  if ((bVar15) &&
                     (pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*
                                          (&local_108), (float)pSVar22->uvIndex == it._M_node._4_4_)
                     ) {
                    pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_108);
                    std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                    ::push_back(&pSVar22->updateList,(value_type *)auStack_b8);
                    break;
                  }
                  std::_List_iterator<Assimp::STransformVecInfo>::operator++(&local_108);
                }
                pvVar21 = std::
                          vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                          ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                        *)local_30,(ulong)(uint)mesh);
                local_120._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
                     end(pvVar21);
                bVar15 = std::operator==(&local_108,&local_120);
                if (bVar15) {
                  pvVar21 = std::
                            vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                          *)local_30,(ulong)(uint)mesh);
                  std::__cxx11::
                  list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
                  push_back(pvVar21,(value_type *)&update.semantic);
                  fVar1 = it._M_node._4_4_;
                  pvVar21 = std::
                            vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                          *)local_30,(ulong)(uint)mesh);
                  pvVar23 = std::__cxx11::
                            list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                            ::back(pvVar21);
                  pvVar23->uvIndex = (uint)fVar1;
                  pvVar21 = std::
                            vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                          *)local_30,(ulong)(uint)mesh);
                  pvVar23 = std::__cxx11::
                            list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                            ::back(pvVar21);
                  std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
                  push_back(&pvVar23->updateList,(value_type *)auStack_b8);
                }
              }
              else {
                pLVar19 = DefaultLogger::get();
                Logger::warn(pLVar19,"UV transformations on 3D mapping channels are not supported");
              }
            }
          }
        }
        STransformVecInfo::~STransformVecInfo((STransformVecInfo *)&update.semantic);
      }
    }
  }
  transformedChannels = 0;
  q = 0;
  mesh_1._4_4_ = 0;
  mesh_1._0_4_ = 0;
LAB_005c7159:
  if ((uint)((meshLists.
              super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
            super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>)
            ._M_impl._M_node._M_size <= (uint)mesh_1) {
    bVar15 = DefaultLogger::isNullLogger();
    if (!bVar15) {
      if (mesh_1._4_4_ == 0) {
        pLVar19 = DefaultLogger::get();
        Logger::debug(pLVar19,"TransformUVCoordsProcess finished");
      }
      else {
        pLVar19 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>(&local_b60,(char (*) [31])"TransformUVCoordsProcess end: ");
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_b60,&transformedChannels);
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(char (*) [23])" output channels (in: ");
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,&q);
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(char (*) [13])", modified: ");
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(uint *)((long)&mesh_1 + 4));
        pbVar26 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(char (*) [2])0xbe169b);
        Formatter::basic_formatter::operator_cast_to_string(&local_9e8,pbVar26);
        Logger::info(pLVar19,&local_9e8);
        std::__cxx11::string::~string((string *)&local_9e8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_b60);
      }
    }
    std::
    vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
    ::~vector((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
               *)local_30);
    return;
  }
  trafo = (MeshTrafoList *)
          (&(meshLists.
             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
             super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
             ._M_impl._M_node.super__List_node_base._M_next)->_M_next)[(uint)mesh_1];
  local_548 = std::
              vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
              ::operator[]((vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            *)local_30,(ulong)(uint)mesh_1);
  uVar18 = aiMesh::GetNumUVChannels((aiMesh *)trafo);
  q = uVar18 + q;
  local_ba9 = true;
  if (trafo[4].
      super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>.
      _M_impl._M_node._M_size != 0) {
    bVar15 = std::__cxx11::
             list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::empty
                       (local_548);
    local_ba9 = true;
    if (!bVar15) {
      sVar24 = std::__cxx11::
               list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::size
                         (local_548);
      local_baa = false;
      if (sVar24 == 1) {
        _cnt_1 = std::__cxx11::
                 list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                           (local_548);
        this_00 = std::_List_iterator<Assimp::STransformVecInfo>::operator->
                            ((_List_iterator<Assimp::STransformVecInfo> *)&cnt_1);
        local_baa = STransformVecInfo::IsUntransformed(this_00);
      }
      local_ba9 = local_baa;
    }
  }
  if (local_ba9 == false) {
    bVar15 = false;
    bVar9 = false;
    local_558 = 0;
    it_1._M_node._4_4_ = 0;
    std::_List_iterator<Assimp::STransformVecInfo>::_List_iterator(&it2);
    std::_List_iterator<Assimp::STransformVecInfo>::_List_iterator(&local_570);
    local_578 = (_List_node_base *)
                std::__cxx11::
                list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                          (local_548);
    it2 = (iterator)local_578;
    while( true ) {
      local_580._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
           ::end(local_548);
      bVar16 = std::operator!=(&it2,&local_580);
      if (!bVar16) break;
      pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
      bVar16 = STransformVecInfo::IsUntransformed(pSVar22);
      if (!bVar16) {
        bVar9 = true;
      }
      pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
      if (pSVar22->lockedPos == 0xffffffff) {
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
        pSVar22->lockedPos = local_558;
        bVar15 = true;
      }
      else {
        local_bb9 = false;
        if (!bVar15) {
          local_588._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                         (local_548);
          bVar16 = std::operator!=(&it2,&local_588);
          local_bb9 = false;
          if (bVar16) {
            pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
            local_bb9 = STransformVecInfo::IsUntransformed(pSVar22);
          }
        }
        if (local_bb9 != false) {
          local_590 = (_List_node_base *)
                      std::__cxx11::
                      list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
                      begin(local_548);
          local_570._M_node = local_590;
          goto LAB_005c7440;
        }
      }
      std::_List_iterator<Assimp::STransformVecInfo>::operator++(&it2);
      local_558 = local_558 + 1;
    }
    goto LAB_005c754c;
  }
  uVar18 = aiMesh::GetNumUVChannels((aiMesh *)trafo);
  transformedChannels = uVar18 + transformedChannels;
  goto LAB_005c8287;
LAB_005c7440:
  bVar15 = std::operator!=(&local_570,&it2);
  if (!bVar15) goto LAB_005c7493;
  pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_570);
  bVar15 = STransformVecInfo::IsUntransformed(pSVar22);
  if (!bVar15) goto LAB_005c7493;
  std::_List_iterator<Assimp::STransformVecInfo>::operator++(&local_570);
  goto LAB_005c7440;
LAB_005c7493:
  plVar12 = local_548;
  std::_List_const_iterator<Assimp::STransformVecInfo>::_List_const_iterator(&local_598,&local_570);
  pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
  local_5a0 = (_List_node_base *)
              std::__cxx11::
              list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::insert
                        (plVar12,local_598,pSVar22);
  plVar12 = local_548;
  std::_List_const_iterator<Assimp::STransformVecInfo>::_List_const_iterator(&local_5a8,&it2);
  local_5b0 = (_List_node_base *)
              std::__cxx11::
              list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::erase
                        (plVar12,local_5a8);
LAB_005c754c:
  if (bVar9) {
    local_558 = 0;
    local_5b8 = (_List_node_base *)
                std::__cxx11::
                list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                          (local_548);
    it2 = (iterator)local_5b8;
    while( true ) {
      local_5c0._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
           ::end(local_548);
      bVar15 = std::operator!=(&it2,&local_5c0);
      if (!bVar15) break;
      pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
      if ((pSVar22->lockedPos != 0xeeeeeeee) &&
         (pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2),
         pSVar22->lockedPos != local_558)) {
        register0x00000000 =
             std::__cxx11::
             list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                       (local_548);
        ref[0] = false;
        ref[1] = false;
        ref[2] = false;
        ref[3] = false;
        local_570._M_node = register0x00000000;
        while (uVar11 = ref._0_4_,
              pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2),
              uVar11 != pSVar22->lockedPos) {
          std::_List_iterator<Assimp::STransformVecInfo>::operator++(&local_570);
        }
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_570);
        if (pSVar22->lockedPos == 0xeeeeeeee) {
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_570);
          pSVar31 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          std::swap<Assimp::STransformVecInfo>(pSVar22,pSVar31);
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          if (pSVar22->lockedPos == it_1._M_node._4_4_) {
            it_1._M_node._4_4_ = local_558;
          }
        }
        else {
          pLVar19 = DefaultLogger::get();
          Logger::error(pLVar19,
                        "Channel mismatch, can\'t compute all transformations properly [design bug]"
                       );
        }
      }
      std::_List_iterator<Assimp::STransformVecInfo>::operator++(&it2);
      local_558 = local_558 + 1;
    }
    for (local_5d8 = 0; local_5d8 < 8; local_5d8 = local_5d8 + 1) {
      abStack_5d4[local_5d8] =
           -((&trafo[4].
               super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
               ._M_impl._M_node._M_size)[local_5d8] == 0) & 1;
    }
    local_5e0 = (_List_node_base *)
                std::__cxx11::
                list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                          (local_548);
    it2 = (iterator)local_5e0;
    while( true ) {
      iStack_5e8 = std::__cxx11::
                   list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::end
                             (local_548);
      bVar15 = std::operator!=(&it2,&stack0xfffffffffffffa18);
      if (!bVar15) break;
      pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
      abStack_5d4[pSVar22->uvIndex] = 1;
      std::_List_iterator<Assimp::STransformVecInfo>::operator++(&it2);
    }
    for (local_5ec = 0; plVar12 = local_548, local_5ec < 8; local_5ec = local_5ec + 1) {
      if ((abStack_5d4[local_5ec] & 1) == 0) {
        STransformVecInfo::STransformVecInfo((STransformVecInfo *)&stack0xfffffffffffff9d0);
        std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
        push_back(plVar12,(STransformVecInfo *)&stack0xfffffffffffff9d0);
        STransformVecInfo::~STransformVecInfo((STransformVecInfo *)&stack0xfffffffffffff9d0);
        uVar18 = local_5ec;
        pvVar23 = std::__cxx11::
                  list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::back
                            (local_548);
        pvVar23->uvIndex = uVar18;
      }
    }
    sVar24 = std::__cxx11::
             list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::size
                       (local_548);
    local_634 = (uint)sVar24;
    if (8 < local_634) {
      bVar15 = DefaultLogger::isNullLogger();
      if (!bVar15) {
        pLVar19 = DefaultLogger::get();
        sVar24 = std::__cxx11::
                 list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::size
                           (local_548);
        old[7]._4_4_ = (undefined4)sVar24;
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>(&local_7d0,(uint *)((long)old + 0x3c));
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_7d0,(char (*) [32])" UV channels required but just ");
        old[7]._0_4_ = 8;
        pbVar25 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(int *)(old + 7));
        pbVar26 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar25,(char (*) [11])0xbbd408);
        Formatter::basic_formatter::operator_cast_to_string(&local_658,pbVar26);
        Logger::error(pLVar19,&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_7d0);
      }
      local_634 = 8;
    }
    for (local_81c = 0; local_81c < 8; local_81c = local_81c + 1) {
      old[(ulong)local_81c - 1] =
           (aiVector3D *)
           (&trafo[4].
             super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
             ._M_impl._M_node._M_size)[local_81c];
    }
    _m = std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
         begin(local_548);
    local_82c = 0;
    it2 = _m;
    while (uVar27 = (ulong)local_82c,
          sVar24 = std::__cxx11::
                   list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::size
                             (local_548), uVar27 < sVar24) {
      if (local_82c < local_634) {
        transformedChannels = transformedChannels + 1;
        bVar15 = DefaultLogger::isNullLogger();
        uVar13 = (uint)mesh_1;
        uVar18 = local_82c;
        if (!bVar15) {
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          fVar1 = (pSVar22->super_aiUVTransform).mTranslation.x;
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          fVar2 = (pSVar22->super_aiUVTransform).mTranslation.y;
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          fVar3 = (pSVar22->super_aiUVTransform).mScaling.x;
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          fVar4 = (pSVar22->super_aiUVTransform).mScaling.y;
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          fVar5 = (pSVar22->super_aiUVTransform).mRotation;
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          pcVar28 = MappingModeToChar(pSVar22->mapU);
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          pcVar29 = MappingModeToChar(pSVar22->mapV);
          snprintf((char *)&inChannels,0x400,
                   "Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                   SUB84((double)fVar1,0),(double)fVar2,(double)fVar3,(double)fVar4,
                   (double)(fVar5 * 57.29578),(ulong)uVar13,(ulong)uVar18,pcVar28,pcVar29);
          pLVar19 = DefaultLogger::get();
          Logger::info(pLVar19,(char *)&inChannels);
        }
        if ((&trafo[4].
              super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
              ._M_impl._M_node._M_size)[local_82c] == 0) {
          uVar27 = (ulong)*(uint *)((long)&(trafo->
                                           super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                           )._M_impl._M_node.super__List_node_base._M_next + 4);
          paVar30 = (aiVector3t<float> *)operator_new__(uVar27 * 0xc);
          if (uVar27 != 0) {
            local_cd0 = paVar30;
            do {
              aiVector3t<float>::aiVector3t(local_cd0);
              local_cd0 = local_cd0 + 1;
            } while (local_cd0 != paVar30 + uVar27);
          }
          (&trafo[4].
            super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>.
            _M_impl._M_node._M_size)[local_82c] = (size_t)paVar30;
        }
        else {
          local_570._M_node = it2._M_node;
          std::_List_iterator<Assimp::STransformVecInfo>::operator++(&local_570);
          local_830 = local_82c + 1;
          while (local_830 < local_634) {
            pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&local_570);
            if (pSVar22->uvIndex == local_82c) {
              local_838 = (_List_node_base *)
                          std::__cxx11::
                          list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                          ::begin(local_548);
              local_570._M_node = local_838;
              break;
            }
            local_830 = local_830 + 1;
            std::_List_iterator<Assimp::STransformVecInfo>::operator++(&local_570);
          }
          src = (aiVector3D *)
                std::__cxx11::
                list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::begin
                          (local_548);
          bVar15 = std::operator==(&local_570,(_Self *)&src);
          if (bVar15) {
            uVar27 = (ulong)*(uint *)((long)&(trafo->
                                             super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                             )._M_impl._M_node.super__List_node_base._M_next + 4);
            paVar30 = (aiVector3t<float> *)operator_new__(uVar27 * 0xc);
            if (uVar27 != 0) {
              local_ca8 = paVar30;
              do {
                aiVector3t<float>::aiVector3t(local_ca8);
                local_ca8 = local_ca8 + 1;
              } while (local_ca8 != paVar30 + uVar27);
            }
            (&trafo[4].
              super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
              ._M_impl._M_node._M_size)[local_82c] = (size_t)paVar30;
          }
        }
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
        paVar8 = old[(ulong)pSVar22->uvIndex - 1];
        dest = (aiVector3D *)
               (&trafo[4].
                 super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                 ._M_impl._M_node._M_size)[local_82c];
        if (paVar8 == (aiVector3D *)0x0) {
          __assert_fail("__null != src",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TextureTransform.cpp"
                        ,0x1fe,"virtual void Assimp::TextureTransformStep::Execute(aiScene *)");
        }
        if (dest != paVar8) {
          memcpy(dest,paVar8,
                 (ulong)*(uint *)((long)&(trafo->
                                         super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                         )._M_impl._M_node.super__List_node_base._M_next + 4) * 0xc)
          ;
        }
        paVar8 = dest + *(uint *)((long)&(trafo->
                                         super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                         )._M_impl._M_node.super__List_node_base._M_next + 4);
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
        bVar15 = STransformVecInfo::IsUntransformed(pSVar22);
        if (!bVar15) {
          pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          pSVar31 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          mesh_1._4_4_ = mesh_1._4_4_ + 1;
          aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)&m2.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)&m3.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)&m4.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)&m5.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)local_91c);
          m5.c2 = (pSVar31->super_aiUVTransform).mScaling.x;
          m4.a3 = (pSVar31->super_aiUVTransform).mScaling.y;
          m2.b1 = 0.5;
          m2.a1 = 0.5;
          m3.b1 = -0.5;
          m3.a1 = -0.5;
          pSVar31 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
          if (0.008726646 < (pSVar31->super_aiUVTransform).mRotation) {
            pSVar31 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
            aiMatrix3x3t<float>::RotationZ
                      ((pSVar31->super_aiUVTransform).mRotation,(aiMatrix3x3t<float> *)&m2.c2);
          }
          m5.a1 = m5.a1 + (pSVar22->super_aiUVTransform).mTranslation.x;
          m5.b1 = m5.b1 + (pSVar22->super_aiUVTransform).mTranslation.y;
          aiMatrix3x3t<float>::operator*
                    (&local_9ac,(aiMatrix3x3t<float> *)&m3.c2,(aiMatrix3x3t<float> *)&m5.c2);
          aiMatrix3x3t<float>::operator*(&local_988,&local_9ac,(aiMatrix3x3t<float> *)&m2.c2);
          aiMatrix3x3t<float>::operator*(&local_964,&local_988,(aiMatrix3x3t<float> *)&m4.c2);
          aiMatrix3x3t<float>::operator*(&local_940,&local_964,(aiMatrix3x3t<float> *)local_91c);
          memcpy(&m2.c2,&local_940,0x24);
          for (; dest != paVar8; dest = dest + 1) {
            dest->z = 1.0;
            aVar32 = ::operator*((aiMatrix3x3t<float> *)&m2.c2,dest);
            local_9c0 = aVar32.z;
            local_9c8 = aVar32._0_8_;
            dest->x = (float)(int)local_9c8;
            dest->y = (float)(int)((ulong)local_9c8 >> 0x20);
            dest->z = local_9c0;
            dest->x = dest->x / dest->z;
            dest->y = dest->y / dest->z;
            dest->z = 0.0;
            local_9b8 = local_9c8;
            local_9b0 = local_9c0;
          }
        }
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
        UpdateUVIndex(&pSVar22->updateList,local_82c);
      }
      else {
        pSVar22 = std::_List_iterator<Assimp::STransformVecInfo>::operator*(&it2);
        UpdateUVIndex(&pSVar22->updateList,it_1._M_node._4_4_);
      }
      local_82c = local_82c + 1;
      std::_List_iterator<Assimp::STransformVecInfo>::operator++(&it2);
    }
  }
LAB_005c8287:
  mesh_1._0_4_ = (uint)mesh_1 + 1;
  goto LAB_005c7159;
}

Assistant:

void TextureTransformStep::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TransformUVCoordsProcess begin");


    /*  We build a per-mesh list of texture transformations we'll need
     *  to apply. To achieve this, we iterate through all materials,
     *  find all textures and get their transformations and UV indices.
     *  Then we search for all meshes using this material.
     */
    typedef std::list<STransformVecInfo> MeshTrafoList;
    std::vector<MeshTrafoList> meshLists(pScene->mNumMeshes);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {

        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)   {

            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.file"))   {
                STransformVecInfo info;

                // Setup a shortcut structure to allow for a fast updating
                // of the UV index later
                TTUpdateInfo update;
                update.mat = (aiMaterial*) mat;
                update.semantic = prop->mSemantic;
                update.index = prop->mIndex;

                // Get textured properties and transform
                for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)  {
                    aiMaterialProperty* prop2 = mat->mProperties[a2];
                    if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex) {
                        continue;
                    }

                    if ( !::strcmp( prop2->mKey.data, "$tex.uvwsrc")) {
                        info.uvIndex = *((int*)prop2->mData);

                        // Store a direct pointer for later use
                        update.directShortcut = (unsigned int*) prop2->mData;
                    }

                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodeu")) {
                        info.mapU = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodev")) {
                        info.mapV = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.uvtrafo"))  {
                        // ValidateDS should check this
                        ai_assert(prop2->mDataLength >= 20);
                        ::memcpy(&info.mTranslation.x,prop2->mData,sizeof(float)*5);

                        // Directly remove this property from the list
                        mat->mNumProperties--;
                        for (unsigned int a3 = a2; a3 < mat->mNumProperties;++a3) {
                            mat->mProperties[a3] = mat->mProperties[a3+1];
                        }

                        delete prop2;

                        // Warn: could be an underflow, but this does not invoke undefined behaviour
                        --a2;
                    }
                }

                // Find out which transformations are to be evaluated
                if (!(configFlags & AI_UVTRAFO_ROTATION)) {
                    info.mRotation = 0.f;
                }
                if (!(configFlags & AI_UVTRAFO_SCALING)) {
                    info.mScaling = aiVector2D(1.f,1.f);
                }
                if (!(configFlags & AI_UVTRAFO_TRANSLATION)) {
                    info.mTranslation = aiVector2D(0.f,0.f);
                }

                // Do some preprocessing
                PreProcessUVTransform(info);
                info.uvIndex = std::min(info.uvIndex,AI_MAX_NUMBER_OF_TEXTURECOORDS -1u);

                // Find out whether this material is used by more than
                // one mesh. This will make our task much, much more difficult!
                unsigned int cnt = 0;
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    if (pScene->mMeshes[n]->mMaterialIndex == i)
                        ++cnt;
                }

                if (!cnt)
                    continue;
                else if (1 != cnt)  {
                    // This material is referenced by more than one mesh!
                    // So we need to make sure the UV index for the texture
                    // is identical for each of it ...
                    info.lockedPos = AI_TT_UV_IDX_LOCK_TBD;
                }

                // Get all corresponding meshes
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    aiMesh* mesh = pScene->mMeshes[n];
                    if (mesh->mMaterialIndex != i || !mesh->mTextureCoords[0])
                        continue;

                    unsigned int uv = info.uvIndex;
                    if (!mesh->mTextureCoords[uv])  {
                        // If the requested UV index is not available, take the first one instead.
                        uv = 0;
                    }

                    if (mesh->mNumUVComponents[info.uvIndex] >= 3){
                        ASSIMP_LOG_WARN("UV transformations on 3D mapping channels are not supported");
                        continue;
                    }

                    MeshTrafoList::iterator it;

                    // Check whether we have this transform setup already
                    for (it = meshLists[n].begin();it != meshLists[n].end(); ++it)  {

                        if ((*it) == info && (*it).uvIndex == uv)   {
                            (*it).updateList.push_back(update);
                            break;
                        }
                    }

                    if (it == meshLists[n].end())   {
                        meshLists[n].push_back(info);
                        meshLists[n].back().uvIndex = uv;
                        meshLists[n].back().updateList.push_back(update);
                    }
                }
            }
        }
    }

    char buffer[1024]; // should be sufficiently large
    unsigned int outChannels = 0, inChannels = 0, transformedChannels = 0;

    // Now process all meshes. Important: we don't remove unreferenced UV channels.
    // This is a job for the RemoveUnreferencedData-Step.
    for (unsigned int q = 0; q < pScene->mNumMeshes;++q)    {

        aiMesh* mesh = pScene->mMeshes[q];
        MeshTrafoList& trafo =  meshLists[q];

        inChannels += mesh->GetNumUVChannels();

        if (!mesh->mTextureCoords[0] || trafo.empty() ||  (trafo.size() == 1 && trafo.begin()->IsUntransformed())) {
            outChannels += mesh->GetNumUVChannels();
            continue;
        }

        // Move untransformed UV channels to the first position in the list ....
        // except if we need a new locked index which should be as small as possible
        bool veto = false, need = false;
        unsigned int cnt = 0;
        unsigned int untransformed = 0;

        MeshTrafoList::iterator it,it2;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt)  {

            if (!(*it).IsUntransformed()) {
                need = true;
            }

            if ((*it).lockedPos == AI_TT_UV_IDX_LOCK_TBD)   {
                // Lock this index and make sure it won't be changed
                (*it).lockedPos = cnt;
                veto = true;
                continue;
            }

            if (!veto && it != trafo.begin() && (*it).IsUntransformed())    {
                for (it2 = trafo.begin();it2 != it; ++it2) {
                    if (!(*it2).IsUntransformed())
                        break;
                }
                trafo.insert(it2,*it);
                trafo.erase(it);
                break;
            }
        }
        if (!need)
            continue;

        // Find all that are not at their 'locked' position and move them to it.
        // Conflicts are possible but quite unlikely.
        cnt = 0;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt) {
            if ((*it).lockedPos != AI_TT_UV_IDX_LOCK_NONE && (*it).lockedPos != cnt) {
                it2 = trafo.begin();unsigned int t = 0;
                while (t != (*it).lockedPos)
                    ++it2;

                if ((*it2).lockedPos != AI_TT_UV_IDX_LOCK_NONE) {
                    ASSIMP_LOG_ERROR("Channel mismatch, can't compute all transformations properly [design bug]");
                    continue;
                }

                std::swap(*it2,*it);
                if ((*it).lockedPos == untransformed)
                    untransformed = cnt;
            }
        }

        // ... and add dummies for all unreferenced channels
        // at the end of the list
        bool ref[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            ref[n] = (!mesh->mTextureCoords[n] ? true : false);

        for (it = trafo.begin();it != trafo.end(); ++it)
            ref[(*it).uvIndex] = true;

        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (ref[n])
                continue;
            trafo.push_back(STransformVecInfo());
            trafo.back().uvIndex = n;
        }

        // Then check whether this list breaks the channel limit.
        // The unimportant ones are at the end of the list, so
        // it shouldn't be too worse if we remove them.
        unsigned int size = (unsigned int)trafo.size();
        if (size > AI_MAX_NUMBER_OF_TEXTURECOORDS) {

            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_ERROR_F(static_cast<unsigned int>(trafo.size()), " UV channels required but just ", 
                    AI_MAX_NUMBER_OF_TEXTURECOORDS, " available");
            }
            size = AI_MAX_NUMBER_OF_TEXTURECOORDS;
        }


        aiVector3D* old[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            old[n] = mesh->mTextureCoords[n];

        // Now continue and generate the output channels. Channels
        // that we're not going to need later can be overridden.
        it = trafo.begin();
        for (unsigned int n = 0; n < trafo.size();++n,++it) {

            if (n >= size)  {
                // Try to use an untransformed channel for all channels we threw over board
                UpdateUVIndex((*it).updateList,untransformed);
                continue;
            }

            outChannels++;

            // Write to the log
            if (!DefaultLogger::isNullLogger()) {
                ::ai_snprintf(buffer,1024,"Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                    q,n,
                    (*it).mTranslation.x,
                    (*it).mTranslation.y,
                    (*it).mScaling.x,
                    (*it).mScaling.y,
                    AI_RAD_TO_DEG( (*it).mRotation),
                    MappingModeToChar ((*it).mapU),
                    MappingModeToChar ((*it).mapV));

                ASSIMP_LOG_INFO(buffer);
            }

            // Check whether we need a new buffer here
            if (mesh->mTextureCoords[n])    {

                it2 = it;++it2;
                for (unsigned int m = n+1; m < size;++m, ++it2) {

                    if ((*it2).uvIndex == n){
                        it2 = trafo.begin();
                        break;
                    }
                }
                if (it2 == trafo.begin()){
                    mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
                }
            }
            else mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];

            aiVector3D* src = old[(*it).uvIndex];
            aiVector3D* dest, *end;
            dest = mesh->mTextureCoords[n];

            ai_assert(NULL != src);

            // Copy the data to the destination array
            if (dest != src)
                ::memcpy(dest,src,sizeof(aiVector3D)*mesh->mNumVertices);

            end = dest + mesh->mNumVertices;

            // Build a transformation matrix and transform all UV coords with it
            if (!(*it).IsUntransformed()) {
                const aiVector2D& trl = (*it).mTranslation;
                const aiVector2D& scl = (*it).mScaling;

                // fixme: simplify ..
                ++transformedChannels;
                aiMatrix3x3 matrix;

                aiMatrix3x3 m2,m3,m4,m5;

                m4.a1 = scl.x;
                m4.b2 = scl.y;

                m2.a3 = m2.b3 = 0.5f;
                m3.a3 = m3.b3 = -0.5f;

                if ((*it).mRotation > AI_TT_ROTATION_EPSILON )
                    aiMatrix3x3::RotationZ((*it).mRotation,matrix);

                m5.a3 += trl.x; m5.b3 += trl.y;
                matrix = m2 * m4 * matrix * m3 * m5;

                for (src = dest; src != end; ++src) { /* manual homogenious divide */
                    src->z = 1.f;
                    *src = matrix * *src;
                    src->x /= src->z;
                    src->y /= src->z;
                    src->z = 0.f;
                }
            }

            // Update all UV indices
            UpdateUVIndex((*it).updateList,n);
        }
    }

    // Print some detailed statistics into the log
    if (!DefaultLogger::isNullLogger()) {

        if (transformedChannels)    {
            ASSIMP_LOG_INFO_F("TransformUVCoordsProcess end: ", outChannels, " output channels (in: ", inChannels, ", modified: ", transformedChannels,")");
        } else {
            ASSIMP_LOG_DEBUG("TransformUVCoordsProcess finished");
        }
    }
}